

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ClampedReLULayerParams::SerializeWithCachedSizes
          (ClampedReLULayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  
  fVar1 = this->alpha_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar1,output);
  }
  fVar1 = this->beta_;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar1,output);
  return;
}

Assistant:

void ClampedReLULayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ClampedReLULayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float alpha = 1;
  if (this->alpha() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->alpha(), output);
  }

  // float beta = 2;
  if (this->beta() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->beta(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ClampedReLULayerParams)
}